

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_uuencode.c
# Opt level: O0

int archive_filter_uuencode_open(archive_write_filter *f)

{
  uint *puVar1;
  size_t sVar2;
  int iVar3;
  ulong uVar4;
  archive_string *paVar5;
  size_t bpb;
  size_t bs;
  private_uuencode *state;
  archive_write_filter *f_local;
  
  puVar1 = (uint *)f->data;
  bpb = 0x10000;
  sVar2 = bpb;
  if (f->archive->magic == 0xb0c5c0de) {
    iVar3 = archive_write_get_bytes_per_block(f->archive);
    uVar4 = (ulong)iVar3;
    sVar2 = uVar4;
    if ((uVar4 < 0x10001) && (sVar2 = bpb, uVar4 != 0)) {
      sVar2 = 0x10000 - 0x10000U % uVar4;
    }
  }
  bpb = sVar2;
  *(size_t *)(puVar1 + 0xe) = bpb;
  paVar5 = archive_string_ensure((archive_string *)(puVar1 + 8),bpb + 0x200);
  if (paVar5 == (archive_string *)0x0) {
    archive_set_error(f->archive,0xc,"Can\'t allocate data for uuencode buffer");
    f_local._4_4_ = -0x1e;
  }
  else {
    archive_string_sprintf
              ((archive_string *)(puVar1 + 8),"begin %o %s\n",(ulong)*puVar1,
               *(undefined8 *)(puVar1 + 2));
    f->data = puVar1;
    f_local._4_4_ = 0;
  }
  return f_local._4_4_;
}

Assistant:

static int
archive_filter_uuencode_open(struct archive_write_filter *f)
{
	struct private_uuencode *state = (struct private_uuencode *)f->data;
	size_t bs = 65536, bpb;

	if (f->archive->magic == ARCHIVE_WRITE_MAGIC) {
		/* Buffer size should be a multiple number of the of bytes
		 * per block for performance. */
		bpb = archive_write_get_bytes_per_block(f->archive);
		if (bpb > bs)
			bs = bpb;
		else if (bpb != 0)
			bs -= bs % bpb;
	}

	state->bs = bs;
	if (archive_string_ensure(&state->encoded_buff, bs + 512) == NULL) {
		archive_set_error(f->archive, ENOMEM,
		    "Can't allocate data for uuencode buffer");
		return (ARCHIVE_FATAL);
	}

	archive_string_sprintf(&state->encoded_buff, "begin %o %s\n",
	    (unsigned int)state->mode, state->name.s);

	f->data = state;
	return (0);
}